

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwrapper.cpp
# Opt level: O2

ws_match_res *
wassersteinMatch(ws_match_res *__return_storage_ptr__,void *tabulator1,void *tabulator2,
                double flow_dist,double other_scale)

{
  undefined1 auVar1 [16];
  tuple<double,_double,_double> tuple;
  tuple<double,_double,_double> local_28;
  
  IsoSpec::FixedEnvelope::WassersteinMatch
            (&local_28,(FixedEnvelope *)tabulator1,(FixedEnvelope *)tabulator2,flow_dist,other_scale
            );
  auVar1._8_4_ = local_28.super__Tuple_impl<0UL,_double,_double,_double>.
                 super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
                 _M_head_impl._0_4_;
  auVar1._0_8_ = local_28.super__Tuple_impl<0UL,_double,_double,_double>.
                 super__Head_base<0UL,_double,_false>._M_head_impl;
  auVar1._12_4_ =
       local_28.super__Tuple_impl<0UL,_double,_double,_double>.
       super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl.
       _4_4_;
  __return_storage_ptr__->res1 =
       (double)local_28.super__Tuple_impl<0UL,_double,_double,_double>.
               super__Head_base<0UL,_double,_false>._M_head_impl;
  __return_storage_ptr__->res2 = (double)auVar1._8_8_;
  __return_storage_ptr__->flow =
       (double)local_28.super__Tuple_impl<0UL,_double,_double,_double>.
               super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
               super__Head_base<2UL,_double,_false>._M_head_impl;
  return __return_storage_ptr__;
}

Assistant:

struct ws_match_res wassersteinMatch(void* tabulator1, void* tabulator2, double flow_dist, double other_scale)
{
    struct ws_match_res res;
    auto tuple = reinterpret_cast<FixedEnvelope*>(tabulator1)->WassersteinMatch(*reinterpret_cast<FixedEnvelope*>(tabulator2), flow_dist, other_scale);
    res.res1 = std::get<0>(tuple);
    res.res2 = std::get<1>(tuple);
    res.flow = std::get<2>(tuple);
    return res;
}